

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Error CheckArgumentValue(char *arg)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  Error EVar1;
  allocator local_41;
  char *arg_local;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,in_RSI,&local_41);
  std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_38);
  arg[0] = '\0';
  arg[1] = '\0';
  arg[2] = '\0';
  arg[3] = '\0';
  arg[4] = '\0';
  arg[5] = '\0';
  arg[6] = '\0';
  arg[7] = '\0';
  arg[8] = '\0';
  arg[9] = '\0';
  arg[10] = '\0';
  arg[0xb] = '\0';
  arg[0xc] = '\0';
  arg[0xd] = '\0';
  arg[0xe] = '\0';
  arg[0xf] = '\0';
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)arg;
  return (Error)EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

gerr::Error CheckArgumentValue(char const* arg) {
  try {
    std::stoi(arg);
  } catch (std::exception const& e) {
    return gerr::New("conv exception:{}", arg, e.what());
  }
  return nullptr;
}